

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

lzma_ret lzma_lzma2_props_encode(void *options,uint8_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  undefined4 local_28;
  uint32_t d;
  lzma_options_lzma *opt;
  uint8_t *out_local;
  void *options_local;
  
  if (*options < 0x1001) {
    local_28 = 0x1000;
  }
  else {
    local_28 = *options;
  }
  uVar1 = local_28 - 1U >> 2 | local_28 - 1U;
  uVar1 = uVar1 >> 3 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  if (uVar1 == 0xffffffff) {
    *out = '(';
  }
  else {
    uVar2 = get_pos_slot(uVar1 + 1);
    *out = (char)uVar2 + 0xe8;
  }
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_lzma2_props_encode(const void *options, uint8_t *out)
{
	const lzma_options_lzma *const opt = options;
	uint32_t d = my_max(opt->dict_size, LZMA_DICT_SIZE_MIN);

	// Round up to the next 2^n - 1 or 2^n + 2^(n - 1) - 1 depending
	// on which one is the next:
	--d;
	d |= d >> 2;
	d |= d >> 3;
	d |= d >> 4;
	d |= d >> 8;
	d |= d >> 16;

	// Get the highest two bits using the proper encoding:
	if (d == UINT32_MAX)
		out[0] = 40;
	else
		out[0] = get_pos_slot(d + 1) - 24;

	return LZMA_OK;
}